

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3IndexedByLookup(Parse *pParse,SrcItem *pFrom)

{
  char *zRight;
  int iVar1;
  bool bVar2;
  Index *local_38;
  Index *pIdx;
  char *zIndexedBy;
  Table *pTab;
  SrcItem *pFrom_local;
  Parse *pParse_local;
  
  zRight = (pFrom->u1).zIndexedBy;
  local_38 = pFrom->pTab->pIndex;
  while( true ) {
    bVar2 = false;
    if (local_38 != (Index *)0x0) {
      iVar1 = sqlite3StrICmp(local_38->zName,zRight);
      bVar2 = iVar1 != 0;
    }
    if (!bVar2) break;
    local_38 = local_38->pNext;
  }
  if (local_38 != (Index *)0x0) {
    (pFrom->u2).pIBIndex = local_38;
  }
  else {
    sqlite3ErrorMsg(pParse,"no such index: %s",zRight,0);
    pParse->checkSchema = '\x01';
  }
  pParse_local._4_4_ = (uint)(local_38 == (Index *)0x0);
  return pParse_local._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3IndexedByLookup(Parse *pParse, SrcItem *pFrom){
  Table *pTab = pFrom->pTab;
  char *zIndexedBy = pFrom->u1.zIndexedBy;
  Index *pIdx;
  assert( pTab!=0 );
  assert( pFrom->fg.isIndexedBy!=0 );

  for(pIdx=pTab->pIndex;
      pIdx && sqlite3StrICmp(pIdx->zName, zIndexedBy);
      pIdx=pIdx->pNext
  );
  if( !pIdx ){
    sqlite3ErrorMsg(pParse, "no such index: %s", zIndexedBy, 0);
    pParse->checkSchema = 1;
    return SQLITE_ERROR;
  }
  assert( pFrom->fg.isCte==0 );
  pFrom->u2.pIBIndex = pIdx;
  return SQLITE_OK;
}